

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O1

void ncnn::convdw3x3s2_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  undefined1 (*pauVar14) [12];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  uint uVar21;
  int iVar22;
  void *pvVar23;
  void *pvVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar143 [12];
  undefined1 auVar144 [12];
  undefined1 auVar145 [12];
  undefined1 auVar146 [12];
  undefined1 auVar147 [12];
  undefined1 auVar148 [28];
  int iVar149;
  long lVar150;
  float *pfVar151;
  float *pfVar152;
  int iVar153;
  uint uVar154;
  int iVar155;
  uint uVar156;
  long lVar157;
  long lVar158;
  float *pfVar159;
  float *pfVar160;
  undefined8 uVar161;
  undefined8 uVar162;
  undefined8 uVar163;
  undefined8 uVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float in_register_0000125c;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float in_register_0000129c;
  float fVar172;
  float in_register_000012dc;
  float fVar173;
  float fVar174;
  float in_register_0000151c;
  float fVar175;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  
  iVar20 = bottom_blob->c;
  if (0 < (long)iVar20) {
    uVar21 = top_blob->w;
    iVar22 = top_blob->h;
    pvVar23 = _bias->data;
    iVar149 = (bottom_blob->w - uVar21) * 0x10;
    lVar158 = 0;
    do {
      if (pvVar23 == (void *)0x0) {
        uVar162 = 0;
        uVar161 = 0;
        uVar163 = 0;
        uVar164 = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)pvVar23 + lVar158 * 0x20);
        uVar161 = *puVar1;
        uVar162 = puVar1[1];
        uVar163 = puVar1[2];
        uVar164 = puVar1[3];
      }
      local_1b8 = (float)uVar161;
      fStack_1b4 = (float)((ulong)uVar161 >> 0x20);
      fStack_1b0 = (float)uVar162;
      fStack_1ac = (float)((ulong)uVar162 >> 0x20);
      fStack_1a8 = (float)uVar163;
      fStack_1a4 = (float)((ulong)uVar163 >> 0x20);
      fStack_1a0 = (float)uVar164;
      fStack_19c = (float)((ulong)uVar164 >> 0x20);
      if (0 < iVar22) {
        pfVar159 = (float *)(top_blob->cstep * lVar158 * top_blob->elemsize + (long)top_blob->data);
        lVar150 = kernel->w * lVar158 * kernel->elemsize;
        pvVar24 = kernel->data;
        pauVar2 = (undefined1 (*) [12])((long)pvVar24 + lVar150);
        auVar145 = *pauVar2;
        local_d8 = (float)*(undefined8 *)*pauVar2;
        fStack_d4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_d0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_cc = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        fStack_c8 = (float)*(undefined8 *)(pauVar2[1] + 4);
        fStack_c4 = (float)((ulong)*(undefined8 *)(pauVar2[1] + 4) >> 0x20);
        fStack_c0 = (float)*(undefined8 *)pauVar2[2];
        fStack_bc = (float)((ulong)*(undefined8 *)pauVar2[2] >> 0x20);
        pauVar6 = (undefined1 (*) [28])((long)pvVar24 + lVar150 + 0x20);
        fVar114 = *(float *)*pauVar6;
        fVar115 = *(float *)(*pauVar6 + 4);
        fVar116 = *(float *)(*pauVar6 + 8);
        fVar117 = *(float *)(*pauVar6 + 0xc);
        fVar118 = *(float *)(*pauVar6 + 0x10);
        fVar119 = *(float *)(*pauVar6 + 0x14);
        fVar120 = *(float *)(*pauVar6 + 0x18);
        auVar148 = *pauVar6;
        fVar121 = *(float *)pauVar6[1];
        pauVar2 = (undefined1 (*) [12])((long)pvVar24 + lVar150 + 0x40);
        auVar146 = *pauVar2;
        auVar143 = *pauVar2;
        pfVar151 = (float *)((long)pvVar24 + lVar150 + 0x60);
        fVar135 = *pfVar151;
        fVar136 = pfVar151[1];
        fVar137 = pfVar151[2];
        fVar138 = pfVar151[3];
        fVar139 = pfVar151[4];
        fVar140 = pfVar151[5];
        fVar141 = pfVar151[6];
        fVar142 = pfVar151[7];
        pauVar14 = (undefined1 (*) [12])((long)pvVar24 + lVar150 + 0x80);
        auVar147 = *pauVar14;
        auVar144 = *pauVar14;
        auVar15 = *(undefined1 (*) [32])((long)pvVar24 + lVar150 + 0xa0);
        pfVar151 = (float *)((long)pvVar24 + lVar150 + 0xc0);
        fVar127 = *pfVar151;
        fVar128 = pfVar151[1];
        fVar129 = pfVar151[2];
        fVar130 = pfVar151[3];
        fVar131 = pfVar151[4];
        fVar132 = pfVar151[5];
        fVar133 = pfVar151[6];
        fVar134 = pfVar151[7];
        auVar16 = *(undefined1 (*) [32])((long)pvVar24 + lVar150 + 0xe0);
        auVar17 = *(undefined1 (*) [32])((long)pvVar24 + lVar150 + 0x100);
        pfVar160 = (float *)(bottom_blob->cstep * lVar158 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
        lVar150 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar152 = (float *)(lVar150 * 2 + (long)pfVar160);
        pfVar151 = (float *)(lVar150 + (long)pfVar160);
        iVar155 = 0;
        local_118 = (float)*(undefined8 *)*pauVar2;
        fStack_114 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_110 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_10c = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        fStack_108 = (float)*(undefined8 *)(pauVar2[1] + 4);
        fStack_104 = (float)((ulong)*(undefined8 *)(pauVar2[1] + 4) >> 0x20);
        fStack_100 = (float)*(undefined8 *)pauVar2[2];
        local_138 = (float)*(undefined8 *)*pauVar14;
        fStack_134 = (float)((ulong)*(undefined8 *)*pauVar14 >> 0x20);
        fStack_130 = (float)*(undefined8 *)(*pauVar14 + 8);
        fStack_12c = (float)((ulong)*(undefined8 *)(*pauVar14 + 8) >> 0x20);
        fStack_128 = (float)*(undefined8 *)(pauVar14[1] + 4);
        fStack_124 = (float)((ulong)*(undefined8 *)(pauVar14[1] + 4) >> 0x20);
        fStack_120 = (float)*(undefined8 *)pauVar14[2];
        fStack_11c = (float)((ulong)*(undefined8 *)pauVar14[2] >> 0x20);
        fVar167 = fVar121;
        do {
          local_78 = auVar17._0_4_;
          fStack_74 = auVar17._4_4_;
          fStack_70 = auVar17._8_4_;
          fStack_6c = auVar17._12_4_;
          fStack_68 = auVar17._16_4_;
          fStack_64 = auVar17._20_4_;
          fStack_60 = auVar17._24_4_;
          local_158 = auVar15._0_4_;
          fStack_154 = auVar15._4_4_;
          fStack_150 = auVar15._8_4_;
          fStack_14c = auVar15._12_4_;
          fStack_148 = auVar15._16_4_;
          fStack_144 = auVar15._20_4_;
          fStack_140 = auVar15._24_4_;
          local_f8 = auVar16._0_4_;
          fStack_f4 = auVar16._4_4_;
          fStack_f0 = auVar16._8_4_;
          fStack_ec = auVar16._12_4_;
          fStack_e8 = auVar16._16_4_;
          fStack_e4 = auVar16._20_4_;
          fStack_e0 = auVar16._24_4_;
          if ((int)uVar21 < 4) {
            uVar154 = 0;
          }
          else {
            iVar153 = 3;
            do {
              fVar167 = pfVar160[1];
              fVar25 = pfVar160[2];
              fVar26 = pfVar160[3];
              fVar27 = pfVar160[4];
              fVar28 = pfVar160[5];
              fVar29 = pfVar160[6];
              fVar30 = pfVar160[9];
              fVar31 = pfVar160[10];
              fVar32 = pfVar160[0xb];
              fVar33 = pfVar160[0xc];
              fVar34 = pfVar160[0xd];
              fVar35 = pfVar160[0xe];
              fVar36 = pfVar160[0x10];
              fVar37 = pfVar160[0x11];
              fVar38 = pfVar160[0x12];
              fVar39 = pfVar160[0x13];
              fVar40 = pfVar160[0x14];
              fVar41 = pfVar160[0x15];
              fVar42 = pfVar160[0x16];
              fVar43 = pfVar160[0x17];
              fVar44 = pfVar151[1];
              fVar45 = pfVar151[2];
              fVar46 = pfVar151[3];
              fVar47 = pfVar151[4];
              fVar48 = pfVar151[5];
              fVar49 = pfVar151[6];
              fVar50 = pfVar151[9];
              fVar51 = pfVar151[10];
              fVar52 = pfVar151[0xb];
              fVar53 = pfVar151[0xc];
              fVar54 = pfVar151[0xd];
              fVar55 = pfVar151[0xe];
              fVar56 = pfVar151[0x10];
              fVar57 = pfVar151[0x11];
              fVar58 = pfVar151[0x12];
              fVar59 = pfVar151[0x13];
              fVar60 = pfVar151[0x14];
              fVar170 = pfVar151[0x15];
              fVar61 = pfVar151[0x16];
              fVar62 = pfVar152[1];
              fVar63 = pfVar152[2];
              fVar64 = pfVar152[3];
              fVar65 = pfVar152[4];
              fVar66 = pfVar152[5];
              fVar67 = pfVar152[6];
              fStack_13c = auVar15._28_4_;
              fStack_dc = auVar16._28_4_;
              fVar68 = pfVar152[9];
              fVar69 = pfVar152[10];
              fVar70 = pfVar152[0xb];
              fVar71 = pfVar152[0xc];
              fVar72 = pfVar152[0xd];
              fVar73 = pfVar152[0xe];
              fVar175 = in_register_0000151c + fStack_19c + fVar134 + in_register_0000151c;
              fVar74 = pfVar160[0x18];
              fVar75 = pfVar160[0x19];
              fVar76 = pfVar160[0x1a];
              fVar77 = pfVar160[0x1b];
              fVar78 = pfVar160[0x1c];
              fVar79 = pfVar160[0x1d];
              fVar80 = pfVar160[0x1e];
              fVar81 = pfVar152[0x10];
              fVar82 = pfVar152[0x11];
              fVar83 = pfVar152[0x12];
              fVar84 = pfVar152[0x13];
              fVar85 = pfVar152[0x14];
              fVar86 = pfVar152[0x15];
              fVar87 = pfVar152[0x16];
              fVar88 = pfVar151[0x18];
              fVar89 = pfVar151[0x19];
              fVar90 = pfVar151[0x1a];
              fVar91 = pfVar151[0x1b];
              fVar92 = pfVar151[0x1c];
              fVar169 = pfVar151[0x1d];
              fVar172 = pfVar151[0x1e];
              fVar174 = pfVar152[0x18];
              fVar93 = pfVar152[0x19];
              fVar94 = pfVar152[0x1a];
              fVar95 = pfVar152[0x1b];
              fVar96 = pfVar152[0x1c];
              fVar97 = pfVar152[0x1d];
              fVar98 = pfVar152[0x1e];
              fVar99 = pfVar151[0x20];
              fVar100 = pfVar151[0x21];
              fVar101 = pfVar151[0x22];
              fVar102 = pfVar151[0x23];
              fVar103 = pfVar151[0x24];
              fVar104 = pfVar151[0x25];
              fVar105 = pfVar151[0x26];
              fVar171 = pfVar151[0x27];
              local_58 = (float)*(undefined8 *)(pfVar160 + 0x20);
              fStack_54 = (float)((ulong)*(undefined8 *)(pfVar160 + 0x20) >> 0x20);
              fStack_50 = (float)*(undefined8 *)(pfVar160 + 0x22);
              fStack_4c = (float)((ulong)*(undefined8 *)(pfVar160 + 0x22) >> 0x20);
              fStack_48 = (float)*(undefined8 *)(pfVar160 + 0x24);
              fStack_44 = (float)((ulong)*(undefined8 *)(pfVar160 + 0x24) >> 0x20);
              fStack_40 = (float)*(undefined8 *)(pfVar160 + 0x26);
              fVar173 = fStack_11c + fStack_dc;
              fVar106 = pfVar152[0x20];
              fVar107 = pfVar152[0x21];
              fVar108 = pfVar152[0x22];
              fVar109 = pfVar152[0x23];
              fVar110 = pfVar152[0x24];
              fVar111 = pfVar152[0x25];
              fVar112 = pfVar152[0x26];
              fVar113 = pfVar152[0x27];
              fVar165 = fVar175 + fVar142 + fVar142 + fVar142 + fVar134 + fStack_13c + fStack_11c;
              fVar168 = fVar43 + fStack_19c + pfVar151[0x17] + fVar175 +
                        fVar142 + fVar121 + fStack_dc;
              *pfVar159 = local_d8 * *pfVar160 + local_1b8 +
                          fVar114 * pfVar160[8] + fVar36 * local_118 +
                          fVar56 * local_158 + fVar135 * *pfVar151 + local_138 * pfVar151[8] +
                          fVar127 * *pfVar152 + local_f8 * pfVar152[8] + fVar81 * local_78;
              pfVar159[1] = fStack_d4 * fVar167 + fStack_1b4 +
                            fVar115 * fVar30 + fVar37 * fStack_114 +
                            fVar57 * fStack_154 + fVar136 * fVar44 + fStack_134 * fVar50 +
                            fVar128 * fVar62 + fStack_f4 * fVar68 + fVar82 * fStack_74;
              pfVar159[2] = fStack_d0 * fVar25 + fStack_1b0 + fVar116 * fVar31 + fVar38 * fStack_110
                            + fVar58 * fStack_150 + fVar137 * fVar45 + fStack_130 * fVar51 +
                            fVar129 * fVar63 + fStack_f0 * fVar69 + fVar83 * fStack_70;
              pfVar159[3] = fStack_cc * fVar26 + fStack_1ac + fVar117 * fVar32 + fVar39 * fStack_10c
                            + fVar59 * fStack_14c + fVar138 * fVar46 + fStack_12c * fVar52 +
                            fVar130 * fVar64 + fStack_ec * fVar70 + fVar84 * fStack_6c;
              pfVar159[4] = fStack_c8 * fVar27 + fStack_1a8 + fVar118 * fVar33 + fVar40 * fStack_108
                            + fVar60 * fStack_148 + fVar139 * fVar47 + fStack_128 * fVar53 +
                            fVar131 * fVar65 + fStack_e8 * fVar71 + fVar85 * fStack_68;
              pfVar159[5] = fStack_c4 * fVar28 + fStack_1a4 + fVar119 * fVar34 + fVar41 * fStack_104
                            + fVar170 * fStack_144 + fVar140 * fVar48 + fStack_124 * fVar54 +
                            fVar132 * fVar66 + fStack_e4 * fVar72 + fVar86 * fStack_64;
              pfVar159[6] = fStack_c0 * fVar29 + fStack_1a0 + fVar120 * fVar35 + fVar42 * fStack_100
                            + fVar61 * fStack_140 + fVar141 * fVar49 + fStack_120 * fVar55 +
                            fVar133 * fVar67 + fStack_e0 * fVar73 + fVar87 * fStack_60;
              pfVar159[7] = fVar165;
              fVar166 = fVar168 + fVar173 + fVar165;
              auVar18 = *(undefined1 (*) [32])(pfVar160 + 0x30);
              fVar165 = pfVar151[0x30];
              fVar175 = pfVar151[0x31];
              fVar122 = pfVar151[0x32];
              fVar123 = pfVar151[0x33];
              fVar124 = pfVar151[0x34];
              fVar125 = pfVar151[0x35];
              fVar126 = pfVar151[0x36];
              in_register_0000151c = pfVar151[0x37];
              fVar25 = pfVar152[0x30];
              fVar26 = pfVar152[0x31];
              fVar27 = pfVar152[0x32];
              fVar28 = pfVar152[0x33];
              fVar29 = pfVar152[0x34];
              fVar30 = pfVar152[0x35];
              fVar31 = pfVar152[0x36];
              fVar167 = pfVar160[0x28];
              fVar32 = pfVar160[0x29];
              fVar33 = pfVar160[0x2a];
              fVar34 = pfVar160[0x2b];
              fVar35 = pfVar160[0x2c];
              fVar44 = pfVar160[0x2d];
              fVar45 = pfVar160[0x2e];
              fVar46 = pfVar151[0x28];
              fVar47 = pfVar151[0x29];
              fVar48 = pfVar151[0x2a];
              fVar49 = pfVar151[0x2b];
              fVar50 = pfVar151[0x2c];
              fVar51 = pfVar151[0x2d];
              fVar52 = pfVar151[0x2e];
              fVar53 = pfVar152[0x28];
              fVar54 = pfVar152[0x29];
              fVar55 = pfVar152[0x2a];
              fVar62 = pfVar152[0x2b];
              fVar63 = pfVar152[0x2c];
              fVar64 = pfVar152[0x2d];
              fVar65 = pfVar152[0x2e];
              pfVar159[8] = fVar36 * local_d8 + local_1b8 + fVar56 * fVar135 + fVar81 * fVar127 +
                            local_138 * fVar88 + fVar114 * fVar74 + local_f8 * fVar174 +
                            local_58 * local_118 + fVar99 * local_158 + local_78 * fVar106;
              pfVar159[9] = fVar37 * fStack_d4 + fStack_1b4 + fVar57 * fVar136 + fVar82 * fVar128 +
                            fStack_134 * fVar89 + fVar115 * fVar75 + fStack_f4 * fVar93 +
                            fStack_54 * fStack_114 + fVar100 * fStack_154 + fStack_74 * fVar107;
              pfVar159[10] = fVar38 * fStack_d0 + fStack_1b0 + fVar58 * fVar137 + fVar83 * fVar129 +
                             fStack_130 * fVar90 + fVar116 * fVar76 + fStack_f0 * fVar94 +
                             fStack_50 * fStack_110 + fVar101 * fStack_150 + fStack_70 * fVar108;
              pfVar159[0xb] =
                   fVar39 * fStack_cc + fStack_1ac + fVar59 * fVar138 + fVar84 * fVar130 +
                   fStack_12c * fVar91 + fVar117 * fVar77 + fStack_ec * fVar95 +
                   fStack_4c * fStack_10c + fVar102 * fStack_14c + fStack_6c * fVar109;
              pfVar159[0xc] =
                   fVar40 * fStack_c8 + fStack_1a8 + fVar60 * fVar139 + fVar85 * fVar131 +
                   fStack_128 * fVar92 + fVar118 * fVar78 + fStack_e8 * fVar96 +
                   fStack_48 * fStack_108 + fVar103 * fStack_148 + fStack_68 * fVar110;
              pfVar159[0xd] =
                   fVar41 * fStack_c4 + fStack_1a4 + fVar170 * fVar140 + fVar86 * fVar132 +
                   fStack_124 * fVar169 + fVar119 * fVar79 + fStack_e4 * fVar97 +
                   fStack_44 * fStack_104 + fVar104 * fStack_144 + fStack_64 * fVar111;
              pfVar159[0xe] =
                   fVar42 * fStack_c0 + fStack_1a0 + fVar61 * fVar141 + fVar87 * fVar133 +
                   fStack_120 * fVar172 + fVar120 * fVar80 + fStack_e0 * fVar98 +
                   fStack_40 * fStack_100 + fVar105 * fStack_140 + fStack_60 * fVar112;
              pfVar159[0xf] = fVar166;
              fVar36 = pfVar160[0x38];
              fVar37 = pfVar160[0x39];
              fVar38 = pfVar160[0x3a];
              fVar39 = pfVar160[0x3b];
              fVar40 = pfVar160[0x3c];
              fVar41 = pfVar160[0x3d];
              fVar42 = pfVar160[0x3e];
              fVar56 = pfVar160[0x40];
              fVar57 = pfVar160[0x41];
              fVar58 = pfVar160[0x42];
              fVar59 = pfVar160[0x43];
              fVar60 = pfVar160[0x44];
              fVar170 = pfVar160[0x45];
              fVar61 = pfVar160[0x46];
              fVar169 = fVar173 + fVar168 + fVar43 + fStack_19c;
              fVar43 = pfVar151[0x38];
              fVar66 = pfVar151[0x39];
              fVar67 = pfVar151[0x3a];
              fVar68 = pfVar151[0x3b];
              fVar69 = pfVar151[0x3c];
              fVar70 = pfVar151[0x3d];
              fVar71 = pfVar151[0x3e];
              fVar72 = pfVar151[0x40];
              fVar73 = pfVar151[0x41];
              fVar74 = pfVar151[0x42];
              fVar75 = pfVar151[0x43];
              fVar76 = pfVar151[0x44];
              fVar77 = pfVar151[0x45];
              fVar78 = pfVar151[0x46];
              fVar174 = fVar171 + fStack_bc + fVar113;
              fVar172 = fStack_bc + fVar171 + fStack_19c;
              fVar79 = pfVar152[0x38];
              fVar80 = pfVar152[0x39];
              fVar81 = pfVar152[0x3a];
              fVar82 = pfVar152[0x3b];
              fVar83 = pfVar152[0x3c];
              fVar84 = pfVar152[0x3d];
              fVar85 = pfVar152[0x3e];
              in_register_000012dc = fStack_bc + fStack_bc + fVar173;
              fVar86 = pfVar152[0x40];
              fVar87 = pfVar152[0x41];
              fVar88 = pfVar152[0x42];
              fVar89 = pfVar152[0x43];
              fVar90 = pfVar152[0x44];
              fVar91 = pfVar152[0x45];
              fVar92 = pfVar152[0x46];
              in_register_0000125c = fVar174 + fVar169;
              in_register_0000129c = fVar174 + fStack_19c + fVar172 + fVar174 + in_register_000012dc
              ;
              pfVar159[0x10] =
                   local_d8 * local_58 + local_1b8 + fVar99 * fVar135 + fVar106 * fVar127 +
                   auVar148._0_4_ * fVar167 + local_138 * fVar46 + local_f8 * fVar53 +
                   fVar25 * local_78 + fVar165 * local_158 + auVar18._0_4_ * local_118;
              pfVar159[0x11] =
                   fStack_d4 * fStack_54 + fStack_1b4 + fVar100 * fVar136 + fVar107 * fVar128 +
                   auVar148._4_4_ * fVar32 + fStack_134 * fVar47 + fStack_f4 * fVar54 +
                   fVar26 * fStack_74 + fVar175 * fStack_154 + auVar18._4_4_ * fStack_114;
              pfVar159[0x12] =
                   fStack_d0 * fStack_50 + fStack_1b0 + fVar101 * fVar137 + fVar108 * fVar129 +
                   auVar148._8_4_ * fVar33 + fStack_130 * fVar48 + fStack_f0 * fVar55 +
                   fVar27 * fStack_70 + fVar122 * fStack_150 + auVar18._8_4_ * fStack_110;
              pfVar159[0x13] =
                   fStack_cc * fStack_4c + fStack_1ac + fVar102 * fVar138 + fVar109 * fVar130 +
                   auVar148._12_4_ * fVar34 + fStack_12c * fVar49 + fStack_ec * fVar62 +
                   fVar28 * fStack_6c + fVar123 * fStack_14c + auVar18._12_4_ * fStack_10c;
              pfVar159[0x14] =
                   fStack_c8 * fStack_48 + fStack_1a8 + fVar103 * fVar139 + fVar110 * fVar131 +
                   auVar148._16_4_ * fVar35 + fStack_128 * fVar50 + fStack_e8 * fVar63 +
                   fVar29 * fStack_68 + fVar124 * fStack_148 + auVar18._16_4_ * fStack_108;
              pfVar159[0x15] =
                   fStack_c4 * fStack_44 + fStack_1a4 + fVar104 * fVar140 + fVar111 * fVar132 +
                   auVar148._20_4_ * fVar44 + fStack_124 * fVar51 + fStack_e4 * fVar64 +
                   fVar30 * fStack_64 + fVar125 * fStack_144 + auVar18._20_4_ * fStack_104;
              pfVar159[0x16] =
                   fStack_c0 * fStack_40 + fStack_1a0 + fVar105 * fVar141 + fVar112 * fVar133 +
                   auVar148._24_4_ * fVar45 + fStack_120 * fVar52 + fStack_e0 * fVar65 +
                   fVar31 * fStack_60 + fVar126 * fStack_140 + auVar18._24_4_ * fStack_100;
              pfVar159[0x17] = fVar166 + fStack_19c + fStack_bc + fVar113 + fVar169 + fVar172;
              fVar167 = in_register_0000129c + in_register_0000125c;
              pfVar159[0x18] =
                   auVar18._0_4_ * local_d8 + local_1b8 + fVar165 * fVar135 + fVar25 * fVar127 +
                   local_f8 * fVar79 + auVar148._0_4_ * fVar36 + local_138 * fVar43 +
                   local_158 * fVar72 + local_118 * fVar56 + local_78 * fVar86;
              pfVar159[0x19] =
                   auVar18._4_4_ * fStack_d4 + fStack_1b4 + fVar175 * fVar136 + fVar26 * fVar128 +
                   fStack_f4 * fVar80 + auVar148._4_4_ * fVar37 + fStack_134 * fVar66 +
                   fStack_154 * fVar73 + fStack_114 * fVar57 + fStack_74 * fVar87;
              pfVar159[0x1a] =
                   auVar18._8_4_ * fStack_d0 + fStack_1b0 + fVar122 * fVar137 + fVar27 * fVar129 +
                   fStack_f0 * fVar81 + auVar148._8_4_ * fVar38 + fStack_130 * fVar67 +
                   fStack_150 * fVar74 + fStack_110 * fVar58 + fStack_70 * fVar88;
              pfVar159[0x1b] =
                   auVar18._12_4_ * fStack_cc + fStack_1ac + fVar123 * fVar138 + fVar28 * fVar130 +
                   fStack_ec * fVar82 + auVar148._12_4_ * fVar39 + fStack_12c * fVar68 +
                   fStack_14c * fVar75 + fStack_10c * fVar59 + fStack_6c * fVar89;
              pfVar159[0x1c] =
                   auVar18._16_4_ * fStack_c8 + fStack_1a8 + fVar124 * fVar139 + fVar29 * fVar131 +
                   fStack_e8 * fVar83 + auVar148._16_4_ * fVar40 + fStack_128 * fVar69 +
                   fStack_148 * fVar76 + fStack_108 * fVar60 + fStack_68 * fVar90;
              pfVar159[0x1d] =
                   auVar18._20_4_ * fStack_c4 + fStack_1a4 + fVar125 * fVar140 + fVar30 * fVar132 +
                   fStack_e4 * fVar84 + auVar148._20_4_ * fVar41 + fStack_124 * fVar70 +
                   fStack_144 * fVar77 + fStack_104 * fVar170 + fStack_64 * fVar91;
              pfVar159[0x1e] =
                   auVar18._24_4_ * fStack_c0 + fStack_1a0 + fVar126 * fVar141 + fVar31 * fVar133 +
                   fStack_e0 * fVar85 + auVar148._24_4_ * fVar42 + fStack_120 * fVar71 +
                   fStack_140 * fVar78 + fStack_100 * fVar61 + fStack_60 * fVar92;
              pfVar159[0x1f] = fVar167;
              pfVar160 = pfVar160 + 0x40;
              pfVar151 = pfVar151 + 0x40;
              pfVar152 = pfVar152 + 0x40;
              pfVar159 = pfVar159 + 0x20;
              iVar153 = iVar153 + 4;
              uVar154 = uVar21 & 0xfffffffc;
            } while (iVar153 < (int)uVar21);
          }
          uVar156 = uVar154 | 1;
          while ((int)uVar156 < (int)uVar21) {
            auVar18 = *(undefined1 (*) [32])(pfVar160 + 0x10);
            auVar19 = *(undefined1 (*) [32])(pfVar151 + 0x10);
            fVar99 = pfVar152[0x10];
            fVar100 = pfVar152[0x11];
            fVar101 = pfVar152[0x12];
            fVar102 = pfVar152[0x13];
            fVar103 = pfVar152[0x14];
            fVar104 = pfVar152[0x15];
            fVar105 = pfVar152[0x16];
            in_register_0000151c = pfVar152[0x17];
            fVar25 = pfVar160[1];
            fVar26 = pfVar160[2];
            fVar27 = pfVar160[3];
            fVar28 = pfVar160[4];
            fVar29 = pfVar160[5];
            fVar30 = pfVar160[6];
            fVar31 = pfVar160[9];
            fVar32 = pfVar160[10];
            fVar33 = pfVar160[0xb];
            fVar34 = pfVar160[0xc];
            fVar35 = pfVar160[0xd];
            fVar36 = pfVar160[0xe];
            fVar37 = pfVar151[1];
            fVar38 = pfVar151[2];
            fVar39 = pfVar151[3];
            fVar40 = pfVar151[4];
            fVar41 = pfVar151[5];
            fVar42 = pfVar151[6];
            fVar43 = pfVar151[9];
            fVar44 = pfVar151[10];
            fVar45 = pfVar151[0xb];
            fVar46 = pfVar151[0xc];
            fVar47 = pfVar151[0xd];
            fVar48 = pfVar151[0xe];
            fVar170 = in_register_0000125c + in_register_0000129c + in_register_0000129c +
                      in_register_0000129c;
            fVar49 = pfVar152[1];
            fVar50 = pfVar152[2];
            fVar51 = pfVar152[3];
            fVar52 = pfVar152[4];
            fVar53 = pfVar152[5];
            fVar54 = pfVar152[6];
            fVar55 = pfVar152[9];
            fVar56 = pfVar152[10];
            fVar57 = pfVar152[0xb];
            fVar58 = pfVar152[0xc];
            fVar59 = pfVar152[0xd];
            fVar60 = pfVar152[0xe];
            fStack_5c = auVar17._28_4_;
            fVar171 = fVar170 + in_register_0000129c + in_register_0000129c;
            fVar167 = fVar167 + fStack_19c + in_register_0000125c + in_register_0000129c + fVar170 +
                      fVar171;
            fVar170 = pfVar160[0x18];
            fVar61 = pfVar160[0x19];
            fVar62 = pfVar160[0x1a];
            fVar63 = pfVar160[0x1b];
            fVar64 = pfVar160[0x1c];
            fVar65 = pfVar160[0x1d];
            fVar66 = pfVar160[0x1e];
            fVar67 = pfVar160[0x20];
            fVar68 = pfVar160[0x21];
            fVar69 = pfVar160[0x22];
            fVar70 = pfVar160[0x23];
            fVar71 = pfVar160[0x24];
            fVar72 = pfVar160[0x25];
            fVar73 = pfVar160[0x26];
            fVar74 = pfVar151[0x18];
            fVar75 = pfVar151[0x19];
            fVar76 = pfVar151[0x1a];
            fVar77 = pfVar151[0x1b];
            fVar78 = pfVar151[0x1c];
            fVar79 = pfVar151[0x1d];
            fVar80 = pfVar151[0x1e];
            fVar81 = pfVar151[0x20];
            fVar82 = pfVar151[0x21];
            fVar83 = pfVar151[0x22];
            fVar84 = pfVar151[0x23];
            fVar85 = pfVar151[0x24];
            fVar86 = pfVar151[0x25];
            fVar87 = pfVar151[0x26];
            fVar88 = pfVar152[0x18];
            fVar89 = pfVar152[0x19];
            fVar90 = pfVar152[0x1a];
            fVar91 = pfVar152[0x1b];
            fVar92 = pfVar152[0x1c];
            fVar169 = pfVar152[0x1d];
            fVar172 = pfVar152[0x1e];
            fVar174 = pfVar152[0x20];
            fVar93 = pfVar152[0x21];
            fVar94 = pfVar152[0x22];
            fVar95 = pfVar152[0x23];
            fVar96 = pfVar152[0x24];
            fVar97 = pfVar152[0x25];
            fVar98 = pfVar152[0x26];
            in_register_0000125c = fVar171 + fVar121 + fVar121;
            in_register_0000129c = in_register_0000129c + fVar121 + fStack_5c;
            *pfVar159 = auVar145._0_4_ * *pfVar160 + local_1b8 +
                        fVar114 * pfVar160[8] + auVar18._0_4_ * auVar143._0_4_ +
                        fVar135 * *pfVar151 + auVar144._0_4_ * pfVar151[8] +
                        auVar19._0_4_ * local_158 +
                        fVar127 * *pfVar152 + local_f8 * pfVar152[8] + fVar99 * local_78;
            pfVar159[1] = auVar145._4_4_ * fVar25 + fStack_1b4 +
                          fVar115 * fVar31 + auVar18._4_4_ * auVar143._4_4_ +
                          fVar136 * fVar37 + auVar144._4_4_ * fVar43 + auVar19._4_4_ * fStack_154 +
                          fVar128 * fVar49 + fStack_f4 * fVar55 + fVar100 * fStack_74;
            pfVar159[2] = auVar145._8_4_ * fVar26 + fStack_1b0 +
                          fVar116 * fVar32 + auVar18._8_4_ * auVar143._8_4_ +
                          fVar137 * fVar38 + auVar144._8_4_ * fVar44 + auVar19._8_4_ * fStack_150 +
                          fVar129 * fVar50 + fStack_f0 * fVar56 + fVar101 * fStack_70;
            pfVar159[3] = fStack_cc * fVar27 + fStack_1ac +
                          fVar117 * fVar33 + auVar18._12_4_ * fStack_10c +
                          fVar138 * fVar39 + fStack_12c * fVar45 + auVar19._12_4_ * fStack_14c +
                          fVar130 * fVar51 + fStack_ec * fVar57 + fVar102 * fStack_6c;
            pfVar159[4] = fStack_c8 * fVar28 + fStack_1a8 +
                          fVar118 * fVar34 + auVar18._16_4_ * fStack_108 +
                          fVar139 * fVar40 + fStack_128 * fVar46 + auVar19._16_4_ * fStack_148 +
                          fVar131 * fVar52 + fStack_e8 * fVar58 + fVar103 * fStack_68;
            pfVar159[5] = fStack_c4 * fVar29 + fStack_1a4 +
                          fVar119 * fVar35 + auVar18._20_4_ * fStack_104 +
                          fVar140 * fVar41 + fStack_124 * fVar47 + auVar19._20_4_ * fStack_144 +
                          fVar132 * fVar53 + fStack_e4 * fVar59 + fVar104 * fStack_64;
            pfVar159[6] = fStack_c0 * fVar30 + fStack_1a0 +
                          fVar120 * fVar36 + auVar18._24_4_ * fStack_100 +
                          fVar141 * fVar42 + fStack_120 * fVar48 + auVar19._24_4_ * fStack_140 +
                          fVar133 * fVar54 + fStack_e0 * fVar60 + fVar105 * fStack_60;
            pfVar159[7] = fVar167;
            in_register_000012dc = fVar121 + fStack_19c;
            fVar167 = in_register_000012dc + fVar167 + fVar121 + in_register_0000125c +
                      in_register_0000129c;
            pfVar159[8] = auVar18._0_4_ * auVar145._0_4_ + local_1b8 +
                          auVar19._0_4_ * fVar135 + fVar99 * fVar127 +
                          fVar114 * fVar170 + auVar144._0_4_ * fVar74 + local_f8 * fVar88 +
                          auVar143._0_4_ * fVar67 + local_158 * fVar81 + local_78 * fVar174;
            pfVar159[9] = auVar18._4_4_ * auVar145._4_4_ + fStack_1b4 +
                          auVar19._4_4_ * fVar136 + fVar100 * fVar128 +
                          fVar115 * fVar61 + auVar144._4_4_ * fVar75 + fStack_f4 * fVar89 +
                          auVar143._4_4_ * fVar68 + fStack_154 * fVar82 + fStack_74 * fVar93;
            pfVar159[10] = auVar18._8_4_ * auVar145._8_4_ + fStack_1b0 +
                           auVar19._8_4_ * fVar137 + fVar101 * fVar129 +
                           fVar116 * fVar62 + auVar144._8_4_ * fVar76 + fStack_f0 * fVar90 +
                           auVar143._8_4_ * fVar69 + fStack_150 * fVar83 + fStack_70 * fVar94;
            pfVar159[0xb] =
                 auVar18._12_4_ * fStack_cc + fStack_1ac +
                 auVar19._12_4_ * fVar138 + fVar102 * fVar130 +
                 fVar117 * fVar63 + fStack_12c * fVar77 + fStack_ec * fVar91 +
                 fStack_10c * fVar70 + fStack_14c * fVar84 + fStack_6c * fVar95;
            pfVar159[0xc] =
                 auVar18._16_4_ * fStack_c8 + fStack_1a8 +
                 auVar19._16_4_ * fVar139 + fVar103 * fVar131 +
                 fVar118 * fVar64 + fStack_128 * fVar78 + fStack_e8 * fVar92 +
                 fStack_108 * fVar71 + fStack_148 * fVar85 + fStack_68 * fVar96;
            pfVar159[0xd] =
                 auVar18._20_4_ * fStack_c4 + fStack_1a4 +
                 auVar19._20_4_ * fVar140 + fVar104 * fVar132 +
                 fVar119 * fVar65 + fStack_124 * fVar79 + fStack_e4 * fVar169 +
                 fStack_104 * fVar72 + fStack_144 * fVar86 + fStack_64 * fVar97;
            pfVar159[0xe] =
                 auVar18._24_4_ * fStack_c0 + fStack_1a0 +
                 auVar19._24_4_ * fVar141 + fVar105 * fVar133 +
                 fVar120 * fVar66 + fStack_120 * fVar80 + fStack_e0 * fVar172 +
                 fStack_100 * fVar73 + fStack_140 * fVar87 + fStack_60 * fVar98;
            pfVar159[0xf] = fVar167;
            pfVar160 = pfVar160 + 0x20;
            pfVar151 = pfVar151 + 0x20;
            pfVar152 = pfVar152 + 0x20;
            pfVar159 = pfVar159 + 0x10;
            uVar156 = uVar154 + 3;
            uVar154 = uVar154 + 2;
          }
          iVar153 = uVar21 - uVar154;
          if (iVar153 != 0 && (int)uVar154 <= (int)uVar21) {
            lVar150 = 0;
            lVar157 = 0;
            do {
              pfVar13 = (float *)((long)pfVar160 + lVar157 * 2);
              fVar25 = pfVar13[1];
              fVar26 = pfVar13[2];
              fVar27 = pfVar13[3];
              fVar28 = pfVar13[4];
              fVar29 = pfVar13[5];
              fVar30 = pfVar13[6];
              pfVar7 = (float *)((long)pfVar160 + lVar157 * 2 + 0x20);
              fVar31 = pfVar7[1];
              fVar32 = pfVar7[2];
              fVar33 = pfVar7[3];
              fVar34 = pfVar7[4];
              fVar35 = pfVar7[5];
              fVar36 = pfVar7[6];
              pfVar8 = (float *)((long)pfVar160 + lVar157 * 2 + 0x40);
              fVar37 = pfVar8[1];
              fVar38 = pfVar8[2];
              fVar39 = pfVar8[3];
              fVar40 = pfVar8[4];
              fVar41 = pfVar8[5];
              fVar42 = pfVar8[6];
              pfVar3 = (float *)((long)pfVar151 + lVar157 * 2);
              fVar43 = pfVar3[1];
              fVar44 = pfVar3[2];
              fVar45 = pfVar3[3];
              fVar46 = pfVar3[4];
              fVar47 = pfVar3[5];
              fVar48 = pfVar3[6];
              pfVar9 = (float *)((long)pfVar151 + lVar157 * 2 + 0x20);
              fVar49 = pfVar9[1];
              fVar50 = pfVar9[2];
              fVar51 = pfVar9[3];
              fVar52 = pfVar9[4];
              fVar53 = pfVar9[5];
              fVar54 = pfVar9[6];
              pfVar10 = (float *)((long)pfVar151 + lVar157 * 2 + 0x40);
              fVar55 = pfVar10[1];
              fVar56 = pfVar10[2];
              fVar57 = pfVar10[3];
              fVar58 = pfVar10[4];
              fVar59 = pfVar10[5];
              fVar60 = pfVar10[6];
              fVar167 = fVar121 + in_register_0000129c + in_register_0000129c + in_register_000012dc
              ;
              pfVar4 = (float *)((long)pfVar152 + lVar157 * 2);
              fVar170 = pfVar4[1];
              fVar61 = pfVar4[2];
              fVar62 = pfVar4[3];
              fVar63 = pfVar4[4];
              fVar64 = pfVar4[5];
              fVar65 = pfVar4[6];
              pfVar11 = (float *)((long)pfVar152 + lVar157 * 2 + 0x20);
              fVar66 = pfVar11[1];
              fVar67 = pfVar11[2];
              fVar68 = pfVar11[3];
              fVar69 = pfVar11[4];
              fVar70 = pfVar11[5];
              fVar71 = pfVar11[6];
              pfVar12 = (float *)((long)pfVar152 + lVar157 * 2 + 0x40);
              fVar72 = pfVar12[1];
              fVar73 = pfVar12[2];
              fVar74 = pfVar12[3];
              fVar75 = pfVar12[4];
              fVar76 = pfVar12[5];
              fVar77 = pfVar12[6];
              in_register_0000125c = in_register_0000129c + fVar167 + in_register_0000129c;
              fVar167 = fStack_bc + fStack_19c + fVar121 + in_register_0000129c + fVar167 +
                        in_register_0000125c;
              pfVar5 = (float *)((long)pfVar159 + lVar157);
              *pfVar5 = local_d8 * *pfVar13 + local_1b8 +
                        fVar114 * *pfVar7 + auVar146._0_4_ * *pfVar8 +
                        fVar135 * *pfVar3 + auVar147._0_4_ * *pfVar9 + local_158 * *pfVar10 +
                        fVar127 * *pfVar4 + local_f8 * *pfVar11 + local_78 * *pfVar12;
              pfVar5[1] = fStack_d4 * fVar25 + fStack_1b4 +
                          fVar115 * fVar31 + auVar146._4_4_ * fVar37 +
                          fVar136 * fVar43 + auVar147._4_4_ * fVar49 + fStack_154 * fVar55 +
                          fVar128 * fVar170 + fStack_f4 * fVar66 + fStack_74 * fVar72;
              pfVar5[2] = fStack_d0 * fVar26 + fStack_1b0 +
                          fVar116 * fVar32 + auVar146._8_4_ * fVar38 +
                          fVar137 * fVar44 + auVar147._8_4_ * fVar50 + fStack_150 * fVar56 +
                          fVar129 * fVar61 + fStack_f0 * fVar67 + fStack_70 * fVar73;
              pfVar5[3] = fStack_cc * fVar27 + fStack_1ac + fVar117 * fVar33 + fStack_10c * fVar39 +
                          fVar138 * fVar45 + fStack_12c * fVar51 + fStack_14c * fVar57 +
                          fVar130 * fVar62 + fStack_ec * fVar68 + fStack_6c * fVar74;
              pfVar5[4] = fStack_c8 * fVar28 + fStack_1a8 + fVar118 * fVar34 + fStack_108 * fVar40 +
                          fVar139 * fVar46 + fStack_128 * fVar52 + fStack_148 * fVar58 +
                          fVar131 * fVar63 + fStack_e8 * fVar69 + fStack_68 * fVar75;
              pfVar5[5] = fStack_c4 * fVar29 + fStack_1a4 + fVar119 * fVar35 + fStack_104 * fVar41 +
                          fVar140 * fVar47 + fStack_124 * fVar53 + fStack_144 * fVar59 +
                          fVar132 * fVar64 + fStack_e4 * fVar70 + fStack_64 * fVar76;
              pfVar5[6] = fStack_c0 * fVar30 + fStack_1a0 + fVar120 * fVar36 + fStack_100 * fVar42 +
                          fVar141 * fVar48 + fStack_120 * fVar54 + fStack_140 * fVar60 +
                          fVar133 * fVar65 + fStack_e0 * fVar71 + fStack_60 * fVar77;
              pfVar5[7] = fVar167;
              lVar157 = lVar157 + 0x20;
              lVar150 = lVar150 + -0x40;
              iVar153 = iVar153 + -1;
            } while (iVar153 != 0);
            pfVar159 = (float *)((long)pfVar159 + lVar157);
            pfVar160 = (float *)((long)pfVar160 - lVar150);
            pfVar151 = (float *)((long)pfVar151 - lVar150);
            pfVar152 = (float *)((long)pfVar152 - lVar150);
          }
          pfVar160 = pfVar160 + iVar149;
          pfVar151 = pfVar151 + iVar149;
          pfVar152 = pfVar152 + iVar149;
          iVar155 = iVar155 + 1;
        } while (iVar155 != iVar22);
      }
      lVar158 = lVar158 + 1;
    } while (lVar158 != iVar20);
  }
  return;
}

Assistant:

static void convdw3x3s2_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 8;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m256 _k00 = _mm256_loadu_ps(k0);
        __m256 _k01 = _mm256_loadu_ps(k0 + 8);
        __m256 _k02 = _mm256_loadu_ps(k0 + 16);
        __m256 _k10 = _mm256_loadu_ps(k0 + 24);
        __m256 _k11 = _mm256_loadu_ps(k0 + 32);
        __m256 _k12 = _mm256_loadu_ps(k0 + 40);
        __m256 _k20 = _mm256_loadu_ps(k0 + 48);
        __m256 _k21 = _mm256_loadu_ps(k0 + 56);
        __m256 _k22 = _mm256_loadu_ps(k0 + 64);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                __m256 _sum2 = _bias0;
                __m256 _r05 = _mm256_loadu_ps(r0 + 40);
                __m256 _r15 = _mm256_loadu_ps(r1 + 40);
                __m256 _r25 = _mm256_loadu_ps(r2 + 40);
                __m256 _r06 = _mm256_loadu_ps(r0 + 48);
                __m256 _r16 = _mm256_loadu_ps(r1 + 48);
                __m256 _r26 = _mm256_loadu_ps(r2 + 48);
                _mm256_storeu_ps(outptr0 + 8, _sum1);

                _sum2 = _mm256_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r26, _sum2);

                __m256 _sum3 = _bias0;
                __m256 _r07 = _mm256_loadu_ps(r0 + 56);
                __m256 _r17 = _mm256_loadu_ps(r1 + 56);
                __m256 _r27 = _mm256_loadu_ps(r2 + 56);
                __m256 _r08 = _mm256_loadu_ps(r0 + 64);
                __m256 _r18 = _mm256_loadu_ps(r1 + 64);
                __m256 _r28 = _mm256_loadu_ps(r2 + 64);
                _mm256_storeu_ps(outptr0 + 16, _sum2);

                _sum3 = _mm256_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm256_storeu_ps(outptr0 + 24, _sum3);

                r0 += 2 * 32;
                r1 += 2 * 32;
                r2 += 2 * 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                __m256 _sum1 = _bias0;
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);
                _mm256_storeu_ps(outptr0, _sum0);

                _sum1 = _mm256_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm256_storeu_ps(outptr0 + 8, _sum1);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm256_storeu_ps(outptr0, _sum0);
                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}